

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Value * __thiscall
soul::heart::Parser::parseNaNandInfinityTokens(Value *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  float v;
  uint uVar2;
  
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"_inf32");
  if (bVar1) {
    v = INFINITY;
  }
  else {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"_ninf32");
    if (bVar1) {
      v = -INFINITY;
    }
    else {
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
              ::matchIf<char_const*>
                        ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                          *)this,"_nan32");
      if (!bVar1) {
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                ::matchIf<char_const*>
                          ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                            *)this,"_inf64");
        if (bVar1) {
          uVar2 = 0x7ff00000;
        }
        else {
          bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                  ::matchIf<char_const*>
                            ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                              *)this,"_ninf64");
          if (bVar1) {
            uVar2 = 0xfff00000;
          }
          else {
            bVar1 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                    ::matchIf<char_const*>
                              ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                                *)this,"_nan64");
            if (!bVar1) {
              (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
              (__return_storage_ptr__->allocatedData).allocatedSize = 0;
              (__return_storage_ptr__->type).category = invalid;
              (__return_storage_ptr__->type).arrayElementCategory = invalid;
              (__return_storage_ptr__->type).isRef = false;
              (__return_storage_ptr__->type).isConstant = false;
              (__return_storage_ptr__->type).primitiveType = invalid;
              (__return_storage_ptr__->type).boundingSize = 0;
              (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
              (__return_storage_ptr__->allocatedData).allocatedData.items =
                   (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
              (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
              (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
              return __return_storage_ptr__;
            }
            uVar2 = 0x7ff80000;
          }
        }
        soul::Value::Value(__return_storage_ptr__,(double)((ulong)uVar2 << 0x20));
        return __return_storage_ptr__;
      }
      v = NAN;
    }
  }
  soul::Value::Value(__return_storage_ptr__,v);
  return __return_storage_ptr__;
}

Assistant:

Value parseNaNandInfinityTokens()
    {
        if (matchIf ("_inf32"))     return soul::Value ( std::numeric_limits<float>::infinity());
        if (matchIf ("_ninf32"))    return soul::Value (-std::numeric_limits<float>::infinity());
        if (matchIf ("_nan32"))     return soul::Value ( std::numeric_limits<float>::quiet_NaN());

        if (matchIf ("_inf64"))     return soul::Value ( std::numeric_limits<double>::infinity());
        if (matchIf ("_ninf64"))    return soul::Value (-std::numeric_limits<double>::infinity());
        if (matchIf ("_nan64"))     return soul::Value ( std::numeric_limits<double>::quiet_NaN());

        return {};
    }